

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

HighsStatus __thiscall HEkk::setBasis(HEkk *this,HighsBasis *highs_basis)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  HighsDebugStatus HVar5;
  int iVar6;
  reference pvVar7;
  const_reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  long in_RSI;
  HighsOptions *in_RDI;
  double upper_1;
  double lower_1;
  HighsInt iVar_1;
  HighsInt iRow;
  double upper;
  double lower;
  HighsInt iVar;
  HighsInt iCol;
  HighsInt num_basic_variables;
  HighsInt num_row;
  HighsInt num_col;
  HighsOptions *options;
  HighsInt in_stack_ffffffffffffff88;
  HighsInt in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int local_4c;
  value_type in_stack_ffffffffffffffb8;
  u64 *in_stack_ffffffffffffffc0;
  int local_30;
  int local_2c;
  HighsStatus local_4;
  
  HVar5 = debugHighsBasisConsistent
                    (in_RDI,(HighsLp *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                     ,(HighsBasis *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (HVar5 == kLogicalError) {
    highsLogDev((HighsLogOptions *)(*(long *)&(in_RDI->super_HighsOptionsStruct).presolve + 0x380),
                kError,"Supposed to be a Highs basis, but not valid\n");
    local_4 = kError;
  }
  else {
    iVar3 = *(int *)&in_RDI[8].super_HighsOptionsStruct.log_file.field_2;
    iVar4 = *(int *)((long)&in_RDI[8].super_HighsOptionsStruct.log_file.field_2 + 4);
    SimplexBasis::setup((SimplexBasis *)
                        CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    *(undefined4 *)&in_RDI[10].super_HighsOptionsStruct.write_presolved_model_file.field_2 =
         *(undefined4 *)(in_RSI + 4);
    *(undefined4 *)
     ((long)&in_RDI[10].super_HighsOptionsStruct.write_presolved_model_file.field_2 + 4) =
         *(undefined4 *)(in_RSI + 8);
    std::__cxx11::string::operator=
              ((string *)
               (in_RDI[10].super_HighsOptionsStruct.write_presolved_model_file.field_2._M_local_buf
               + 8),(string *)(in_RSI + 0x10));
    local_2c = 0;
    for (local_30 = 0; local_30 < iVar3; local_30 = local_30 + 1) {
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &in_RDI[8].super_HighsOptionsStruct.write_presolved_model_file,
                          (long)local_30);
      in_stack_ffffffffffffffc0 = (u64 *)*pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          ((long)&in_RDI[8].super_HighsOptionsStruct.write_presolved_model_file.
                                  field_2 + 8),(long)local_30);
      in_stack_ffffffffffffffb8 = *pvVar7;
      pvVar8 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                         ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                          (in_RSI + 0x30),(long)local_30);
      if (*pvVar8 == kBasic) {
        pvVar9 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           ((vector<signed_char,_std::allocator<signed_char>_> *)
                            &in_RDI[10].super_HighsOptionsStruct.log_file._M_string_length,
                            (long)local_30);
        *pvVar9 = '\0';
        pvVar9 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           ((vector<signed_char,_std::allocator<signed_char>_> *)
                            &in_RDI[10].super_HighsOptionsStruct.write_model_to_file,(long)local_30)
        ;
        *pvVar9 = '\0';
        iVar6 = local_30;
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)
                             &in_RDI[10].super_HighsOptionsStruct.simplex_iteration_limit,
                             (long)local_2c);
        *pvVar10 = iVar6;
        HighsHashHelpers::sparse_combine
                  (in_stack_ffffffffffffffc0,(HighsInt)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
        local_2c = local_2c + 1;
      }
      else {
        pvVar9 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           ((vector<signed_char,_std::allocator<signed_char>_> *)
                            &in_RDI[10].super_HighsOptionsStruct.log_file._M_string_length,
                            (long)local_30);
        *pvVar9 = '\x01';
        if (((double)in_stack_ffffffffffffffc0 != in_stack_ffffffffffffffb8) ||
           (NAN((double)in_stack_ffffffffffffffc0) || NAN(in_stack_ffffffffffffffb8))) {
          pvVar8 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                             ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                              (in_RSI + 0x30),(long)local_30);
          if (*pvVar8 == kLower) {
            pvVar9 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                               ((vector<signed_char,_std::allocator<signed_char>_> *)
                                &in_RDI[10].super_HighsOptionsStruct.write_model_to_file,
                                (long)local_30);
            *pvVar9 = '\x01';
          }
          else {
            pvVar8 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                               ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                                (in_RSI + 0x30),(long)local_30);
            if (*pvVar8 == kUpper) {
              pvVar9 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                                 ((vector<signed_char,_std::allocator<signed_char>_> *)
                                  &in_RDI[10].super_HighsOptionsStruct.write_model_to_file,
                                  (long)local_30);
              *pvVar9 = -1;
            }
            else {
              pvVar9 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                                 ((vector<signed_char,_std::allocator<signed_char>_> *)
                                  &in_RDI[10].super_HighsOptionsStruct.write_model_to_file,
                                  (long)local_30);
              *pvVar9 = '\0';
            }
          }
        }
        else {
          pvVar9 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                             ((vector<signed_char,_std::allocator<signed_char>_> *)
                              &in_RDI[10].super_HighsOptionsStruct.write_model_to_file,
                              (long)local_30);
          *pvVar9 = '\0';
        }
      }
    }
    for (local_4c = 0; local_4c < iVar4; local_4c = local_4c + 1) {
      iVar6 = iVar3 + local_4c;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &in_RDI[8].super_HighsOptionsStruct.pdlp_e_restart_method,(long)local_4c);
      dVar1 = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &in_RDI[8].super_HighsOptionsStruct.iis_strategy,(long)local_4c);
      dVar2 = *pvVar7;
      pvVar8 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                         ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                          (in_RSI + 0x48),(long)local_4c);
      if (*pvVar8 == kBasic) {
        pvVar9 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           ((vector<signed_char,_std::allocator<signed_char>_> *)
                            &in_RDI[10].super_HighsOptionsStruct.log_file._M_string_length,
                            (long)iVar6);
        *pvVar9 = '\0';
        pvVar9 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           ((vector<signed_char,_std::allocator<signed_char>_> *)
                            &in_RDI[10].super_HighsOptionsStruct.write_model_to_file,(long)iVar6);
        *pvVar9 = '\0';
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)
                             &in_RDI[10].super_HighsOptionsStruct.simplex_iteration_limit,
                             (long)local_2c);
        *pvVar10 = iVar6;
        HighsHashHelpers::sparse_combine
                  (in_stack_ffffffffffffffc0,(HighsInt)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
        local_2c = local_2c + 1;
      }
      else {
        pvVar9 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           ((vector<signed_char,_std::allocator<signed_char>_> *)
                            &in_RDI[10].super_HighsOptionsStruct.log_file._M_string_length,
                            (long)iVar6);
        *pvVar9 = '\x01';
        if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
          pvVar8 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                             ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                              (in_RSI + 0x48),(long)local_4c);
          if (*pvVar8 == kLower) {
            pvVar9 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                               ((vector<signed_char,_std::allocator<signed_char>_> *)
                                &in_RDI[10].super_HighsOptionsStruct.write_model_to_file,(long)iVar6
                               );
            *pvVar9 = -1;
          }
          else {
            pvVar8 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                               ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                                (in_RSI + 0x48),(long)local_4c);
            if (*pvVar8 == kUpper) {
              pvVar9 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                                 ((vector<signed_char,_std::allocator<signed_char>_> *)
                                  &in_RDI[10].super_HighsOptionsStruct.write_model_to_file,
                                  (long)iVar6);
              *pvVar9 = '\x01';
            }
            else {
              pvVar9 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                                 ((vector<signed_char,_std::allocator<signed_char>_> *)
                                  &in_RDI[10].super_HighsOptionsStruct.write_model_to_file,
                                  (long)iVar6);
              *pvVar9 = '\0';
            }
          }
        }
        else {
          pvVar9 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                             ((vector<signed_char,_std::allocator<signed_char>_> *)
                              &in_RDI[10].super_HighsOptionsStruct.write_model_to_file,(long)iVar6);
          *pvVar9 = '\0';
        }
      }
    }
    *(undefined1 *)&in_RDI[9].super_HighsOptionsStruct.user_bound_scale = 1;
    local_4 = kOk;
  }
  return local_4;
}

Assistant:

HighsStatus HEkk::setBasis(const HighsBasis& highs_basis) {
  // Shouldn't have to check the incoming basis since this is an
  // internal call, but it may be a basis that's set up internally
  // with errors :-) ...
  //
  if (kDebugMipNodeDualFeasible) {
    // The basis should be dual feasible unless it was alien
    debug_dual_feasible = !highs_basis.was_alien;
  } else {
    assert(!debug_dual_feasible);
  }
  HighsOptions& options = *options_;
  if (debugHighsBasisConsistent(options, lp_, highs_basis) ==
      HighsDebugStatus::kLogicalError) {
    highsLogDev(options_->log_options, HighsLogType::kError,
                "Supposed to be a Highs basis, but not valid\n");
    return HighsStatus::kError;
  }
  HighsInt num_col = lp_.num_col_;
  HighsInt num_row = lp_.num_row_;
  // Set up the basis in case it has not yet been done for this LP
  basis_.setup(num_col, num_row);
  basis_.debug_id = highs_basis.debug_id;
  basis_.debug_update_count = highs_basis.debug_update_count;
  basis_.debug_origin_name = highs_basis.debug_origin_name;
  assert(basis_.debug_origin_name != "");
  HighsInt num_basic_variables = 0;
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    HighsInt iVar = iCol;
    const double lower = lp_.col_lower_[iCol];
    const double upper = lp_.col_upper_[iCol];
    if (highs_basis.col_status[iCol] == HighsBasisStatus::kBasic) {
      basis_.nonbasicFlag_[iVar] = kNonbasicFlagFalse;
      basis_.nonbasicMove_[iVar] = 0;
      basis_.basicIndex_[num_basic_variables++] = iVar;
      HighsHashHelpers::sparse_combine(basis_.hash, iVar);
    } else {
      basis_.nonbasicFlag_[iVar] = kNonbasicFlagTrue;
      if (lower == upper) {
        basis_.nonbasicMove_[iVar] = kNonbasicMoveZe;
      } else if (highs_basis.col_status[iCol] == HighsBasisStatus::kLower) {
        basis_.nonbasicMove_[iVar] = kNonbasicMoveUp;
      } else if (highs_basis.col_status[iCol] == HighsBasisStatus::kUpper) {
        basis_.nonbasicMove_[iVar] = kNonbasicMoveDn;
      } else {
        assert(highs_basis.col_status[iCol] == HighsBasisStatus::kZero);
        basis_.nonbasicMove_[iVar] = kNonbasicMoveZe;
      }
    }
  }
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    HighsInt iVar = num_col + iRow;
    const double lower = lp_.row_lower_[iRow];
    const double upper = lp_.row_upper_[iRow];
    if (highs_basis.row_status[iRow] == HighsBasisStatus::kBasic) {
      basis_.nonbasicFlag_[iVar] = kNonbasicFlagFalse;
      basis_.nonbasicMove_[iVar] = 0;
      basis_.basicIndex_[num_basic_variables++] = iVar;
      HighsHashHelpers::sparse_combine(basis_.hash, iVar);
    } else {
      basis_.nonbasicFlag_[iVar] = kNonbasicFlagTrue;
      if (lower == upper) {
        basis_.nonbasicMove_[iVar] = kNonbasicMoveZe;
      } else if (highs_basis.row_status[iRow] == HighsBasisStatus::kLower) {
        basis_.nonbasicMove_[iVar] = kNonbasicMoveDn;
      } else if (highs_basis.row_status[iRow] == HighsBasisStatus::kUpper) {
        basis_.nonbasicMove_[iVar] = kNonbasicMoveUp;
      } else {
        assert(highs_basis.row_status[iRow] == HighsBasisStatus::kZero);
        basis_.nonbasicMove_[iVar] = kNonbasicMoveZe;
      }
    }
  }
  status_.has_basis = true;
  return HighsStatus::kOk;
}